

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_allocator.cpp
# Opt level: O3

void __thiscall
duckdb::FixedSizeAllocator::Merge(FixedSizeAllocator *this,FixedSizeAllocator *other)

{
  _Hash_node_base *p_Var1;
  _Hash_node_base *p_Var2;
  FixedSizeBuffer *pFVar3;
  FixedSizeAllocator *pFVar4;
  _Hash_node_base *p_Var5;
  __hashtable *__h;
  optional_idx local_58;
  FixedSizeBuffer *local_50;
  FixedSizeAllocator *local_48;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_40;
  undefined1 *local_38;
  
  p_Var5 = (this->buffers)._M_h._M_before_begin._M_nxt;
  p_Var2 = (_Hash_node_base *)0x0;
  while (p_Var5 != (_Hash_node_base *)0x0) {
    p_Var1 = p_Var5 + 1;
    p_Var5 = p_Var5->_M_nxt;
    if (p_Var2 <= p_Var1->_M_nxt) {
      p_Var2 = (_Hash_node_base *)((long)&p_Var1->_M_nxt->_M_nxt + 1);
    }
  }
  p_Var5 = (other->buffers)._M_h._M_before_begin._M_nxt;
  local_48 = other;
  if (p_Var5 != (_Hash_node_base *)0x0) {
    do {
      local_58.index = (long)&p_Var2->_M_nxt + (long)&(p_Var5[1]._M_nxt)->_M_nxt;
      local_50 = (FixedSizeBuffer *)p_Var5[2]._M_nxt;
      p_Var5[2]._M_nxt = (_Hash_node_base *)0x0;
      ::std::
      _Hashtable<unsigned_long,std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::FixedSizeBuffer,std::default_delete<duckdb::FixedSizeBuffer>,true>>,std::allocator<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::FixedSizeBuffer,std::default_delete<duckdb::FixedSizeBuffer>,true>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _M_emplace<std::pair<unsigned_long,duckdb::unique_ptr<duckdb::FixedSizeBuffer,std::default_delete<duckdb::FixedSizeBuffer>,true>>>
                ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::FixedSizeBuffer,std::default_delete<duckdb::FixedSizeBuffer>,true>>,std::allocator<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::FixedSizeBuffer,std::default_delete<duckdb::FixedSizeBuffer>,true>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&this->buffers,&local_58);
      pFVar3 = local_50;
      if (local_50 != (FixedSizeBuffer *)0x0) {
        FixedSizeBuffer::~FixedSizeBuffer(local_50);
        operator_delete(pFVar3);
      }
      p_Var5 = p_Var5->_M_nxt;
    } while (p_Var5 != (_Hash_node_base *)0x0);
  }
  pFVar4 = local_48;
  ::std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(local_48->buffers)._M_h);
  local_40 = &(pFVar4->buffers_with_free_space)._M_h;
  p_Var5 = (pFVar4->buffers_with_free_space)._M_h._M_before_begin._M_nxt;
  if (p_Var5 != (_Hash_node_base *)0x0) {
    do {
      local_38 = (undefined1 *)((long)&p_Var2->_M_nxt + (long)&(p_Var5[1]._M_nxt)->_M_nxt);
      local_58.index = (idx_t)&this->buffers_with_free_space;
      ::std::
      _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_long,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&this->buffers_with_free_space,&local_38,&local_58);
      p_Var5 = p_Var5->_M_nxt;
    } while (p_Var5 != (_Hash_node_base *)0x0);
  }
  ::std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::clear(local_40);
  if ((this->buffers_with_free_space)._M_h._M_element_count == 0) {
    local_58.index = 0xffffffffffffffff;
  }
  else {
    optional_idx::optional_idx
              (&local_58,
               (idx_t)(this->buffers_with_free_space)._M_h._M_before_begin._M_nxt[1]._M_nxt);
  }
  (this->buffer_with_free_space).index = local_58.index;
  this->total_segment_count = this->total_segment_count + local_48->total_segment_count;
  return;
}

Assistant:

void FixedSizeAllocator::Merge(FixedSizeAllocator &other) {
	D_ASSERT(segment_size == other.segment_size);

	// remember the buffer count and merge the buffers
	idx_t upper_bound_id = GetUpperBoundBufferId();
	for (auto &buffer : other.buffers) {
		buffers.insert(make_pair(buffer.first + upper_bound_id, std::move(buffer.second)));
	}
	other.buffers.clear();

	// merge the buffers with free spaces
	for (auto &buffer_id : other.buffers_with_free_space) {
		buffers_with_free_space.insert(buffer_id + upper_bound_id);
	}
	other.buffers_with_free_space.clear();
	NextBufferWithFreeSpace();

	// add the total allocations
	total_segment_count += other.total_segment_count;
}